

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.h
# Opt level: O0

void __thiscall
leveldb::InternalKey::InternalKey(InternalKey *this,Slice *user_key,SequenceNumber s,ValueType t)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  SequenceNumber *in_stack_ffffffffffffff88;
  Slice *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  string *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  key = in_RDI;
  std::__cxx11::string::string(in_RDI);
  ParsedInternalKey::ParsedInternalKey
            ((ParsedInternalKey *)in_RDI,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             kTypeDeletion);
  AppendInternalKey(in_stack_ffffffffffffffa8,(ParsedInternalKey *)key);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

InternalKey(const Slice& user_key, SequenceNumber s, ValueType t) {
    AppendInternalKey(&rep_, ParsedInternalKey(user_key, s, t));
  }